

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O3

_Bool has_test(TestSuite *suite,char *name)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  anon_union_8_2_f5956e59_for_Runnable *paVar5;
  _Bool _Var6;
  bool bVar7;
  
  uVar4 = (ulong)suite->size;
  if ((long)uVar4 < 1) {
    _Var6 = false;
  }
  else {
    paVar5 = &suite->tests->Runnable;
    _Var6 = true;
    uVar3 = 1;
    do {
      if (((UnitTest *)(paVar5 + -2))->type == 0) {
        iVar2 = strcmp((char *)paVar5[-1].test,name);
        if (iVar2 == 0) {
          return _Var6;
        }
      }
      else {
        _Var1 = has_test(paVar5->suite,name);
        if (_Var1) {
          return _Var6;
        }
      }
      _Var6 = uVar3 < uVar4;
      paVar5 = paVar5 + 3;
      bVar7 = uVar3 != uVar4;
      uVar3 = uVar3 + 1;
    } while (bVar7);
  }
  return _Var6;
}

Assistant:

bool has_test(TestSuite *suite, const char *name) {
	int i;
	for (i = 0; i < suite->size; i++) {
        if (suite->tests[i].type == test_function) {
            if (strcmp(suite->tests[i].name, name) == 0) {
                return true;
            }
        } else if (has_test(suite->tests[i].Runnable.suite, name)) {
            return true;
        }
	}

	return false;
}